

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O3

_Bool Open_JTalk_synthesis(Open_JTalk *open_jtalk,char *txt,FILE *wavfp,FILE *logfp)

{
  NJD *njd;
  JPCommon *jpcommon;
  HTS_Engine *engine;
  HTS_Boolean HVar1;
  int iVar2;
  char **ppcVar3;
  _Bool _Var4;
  char buff [1024];
  char local_438 [1032];
  
  if (open_jtalk == (Open_JTalk *)0x0) {
    _Var4 = false;
  }
  else {
    text2mecab(local_438,txt);
    Mecab_analysis(&open_jtalk->mecab,local_438);
    njd = &open_jtalk->njd;
    ppcVar3 = Mecab_get_feature(&open_jtalk->mecab);
    iVar2 = Mecab_get_size(&open_jtalk->mecab);
    mecab2njd(njd,ppcVar3,iVar2);
    njd_set_pronunciation(njd);
    njd_set_digit(njd);
    njd_set_accent_phrase(njd);
    njd_set_accent_type(njd);
    njd_set_unvoiced_vowel(njd);
    njd_set_long_vowel(njd);
    jpcommon = &open_jtalk->jpcommon;
    njd2jpcommon(jpcommon,njd);
    JPCommon_make_label(jpcommon);
    iVar2 = JPCommon_get_label_size(jpcommon);
    if (iVar2 < 3) {
      _Var4 = false;
    }
    else {
      engine = &open_jtalk->engine;
      ppcVar3 = JPCommon_get_label_feature(jpcommon);
      iVar2 = JPCommon_get_label_size(jpcommon);
      HVar1 = HTS_Engine_synthesize_from_strings(engine,ppcVar3,(long)iVar2);
      _Var4 = HVar1 == '\x01';
      if (wavfp != (FILE *)0x0) {
        HTS_Engine_save_riff(engine,wavfp);
      }
      if (logfp != (FILE *)0x0) {
        NJD_fprint(njd,logfp);
        HTS_Engine_save_label(engine,logfp);
        HTS_Engine_save_information(engine,logfp);
      }
      HTS_Engine_refresh(engine);
    }
    JPCommon_refresh(jpcommon);
    NJD_refresh(njd);
    Mecab_refresh(&open_jtalk->mecab);
  }
  return _Var4;
}

Assistant:

bool Open_JTalk_synthesis(Open_JTalk *open_jtalk, const char *txt, FILE *wavfp, FILE *logfp)
{
	if (open_jtalk == NULL)
	{
		return false;
	}
	bool result = false;
	char buff[MAXBUFLEN];

	text2mecab(buff, txt);
	Mecab_analysis(&open_jtalk->mecab, buff);
	mecab2njd(&open_jtalk->njd, Mecab_get_feature(&open_jtalk->mecab),
			  Mecab_get_size(&open_jtalk->mecab));
	njd_set_pronunciation(&open_jtalk->njd);
	njd_set_digit(&open_jtalk->njd);
	njd_set_accent_phrase(&open_jtalk->njd);
	njd_set_accent_type(&open_jtalk->njd);
	njd_set_unvoiced_vowel(&open_jtalk->njd);
	njd_set_long_vowel(&open_jtalk->njd);
	njd2jpcommon(&open_jtalk->jpcommon, &open_jtalk->njd);
	JPCommon_make_label(&open_jtalk->jpcommon);
	if (JPCommon_get_label_size(&open_jtalk->jpcommon) > 2)
	{
		if (HTS_Engine_synthesize_from_strings(&open_jtalk->engine, JPCommon_get_label_feature(&open_jtalk->jpcommon),
											   JPCommon_get_label_size(&open_jtalk->jpcommon)) == true)
			result = true;
		if (wavfp != NULL)
			HTS_Engine_save_riff(&open_jtalk->engine, wavfp);
		if (logfp != NULL)
		{
			NJD_fprint(&open_jtalk->njd, logfp);
			HTS_Engine_save_label(&open_jtalk->engine, logfp);
			HTS_Engine_save_information(&open_jtalk->engine, logfp);
		}
		HTS_Engine_refresh(&open_jtalk->engine);
	}
	JPCommon_refresh(&open_jtalk->jpcommon);
	NJD_refresh(&open_jtalk->njd);
	Mecab_refresh(&open_jtalk->mecab);

	return result;
}